

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void rsg::(anonymous_namespace)::convertExecValueTempl<int,float>
               (ExecConstValueAccess src,ExecValueAccess dst)

{
  int ndx;
  long lVar1;
  float fVar2;
  
  lVar1 = 0;
  do {
    if (src.m_value[lVar1].intVal == 0x7fffffff) {
      fVar2 = INFINITY;
    }
    else {
      fVar2 = (float)src.m_value[lVar1].intVal;
    }
    dst.super_ConstStridedValueAccess<64>.m_value[lVar1].intVal = (int)fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  return;
}

Assistant:

void convertExecValueTempl (ExecConstValueAccess src, ExecValueAccess dst)
{
	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		dst.as<DstType>(ndx) = convert<SrcType, DstType>(src.as<SrcType>(ndx));
}